

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_0::NetworkAddressImpl::connect
          (NetworkAddressImpl *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  long lVar3;
  TransformPromiseNodeBase *this_00;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs;
  Promise<kj::AuthenticatedStream> promise;
  Array<kj::(anonymous_namespace)::SocketAddress> addrsCopy;
  OwnPromiseNode local_58;
  undefined1 local_50 [24];
  bool local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  content.size_._4_4_ = in_register_0000000c;
  content.size_._0_4_ = __len;
  content.ptr = *(SocketAddress **)(lVar3 + 0x20);
  heapArray<kj::(anonymous_namespace)::SocketAddress>
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)(local_50 + 0x10),
             *(kj **)(lVar3 + 0x18),content);
  addrs.size_ = local_50._16_8_;
  addrs.ptr = *(SocketAddress **)(lVar3 + 0x10);
  connectImpl((LowLevelAsyncIoProvider *)local_50,*(NetworkFilter **)(lVar3 + 8),addrs,local_38);
  Promise<kj::AuthenticatedStream>::attach<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Promise<kj::AuthenticatedStream> *)&local_58,
             (Array<kj::(anonymous_namespace)::SocketAddress> *)local_50);
  pPVar1 = ((local_58.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar2 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1557:15)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar2 + 0x3d8) = &PTR_destroy_0059bd60;
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_58.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1557:15)>
               ::anon_class_1_0_00000001_for_func::operator());
    local_58.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0059bd60;
    local_58.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_50._8_8_ = 0;
  (this->super_NetworkAddress)._vptr_NetworkAddress = (_func_int **)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_50 + 8));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_50);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)(local_50 + 0x10));
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> connect() override {
    auto addrsCopy = heapArray(addrs.asPtr());
    auto promise = connectImpl(lowLevel, filter, addrsCopy, false);
    return promise.attach(kj::mv(addrsCopy))
        .then([](AuthenticatedStream&& a) { return kj::mv(a.stream); });
  }